

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcwidth.c
# Opt level: O0

_Bool bisearch(uint ucs,interval *table,int max)

{
  int iVar1;
  int local_20;
  int mid;
  int min;
  int max_local;
  interval *table_local;
  uint ucs_local;
  
  local_20 = 0;
  if ((table->first <= ucs) && (mid = max, ucs <= table[max].last)) {
    while (local_20 <= mid) {
      iVar1 = (local_20 + mid) / 2;
      if (table[iVar1].last < ucs) {
        local_20 = iVar1 + 1;
      }
      else {
        if (table[iVar1].first <= ucs) {
          return true;
        }
        mid = iVar1 + -1;
      }
    }
  }
  return false;
}

Assistant:

static bool bisearch(unsigned int ucs, const struct interval *table, int max) {
  int min = 0;
  int mid;

  if (ucs < table[0].first || ucs > table[max].last)
    return false;
  while (max >= min) {
    mid = (min + max) / 2;
    if (ucs > table[mid].last)
      min = mid + 1;
    else if (ucs < table[mid].first)
      max = mid - 1;
    else
      return true;
  }

  return false;
}